

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_helpers.h
# Opt level: O0

void test_helper_psa_done(int line,char *file)

{
  char *file_local;
  int line_local;
  
  test_helper_is_psa_pristine(line,file);
  mbedtls_psa_crypto_free();
  return;
}

Assistant:

static void test_helper_psa_done( int line, const char *file )
{
    (void) test_helper_is_psa_pristine( line, file );
    mbedtls_psa_crypto_free( );
}